

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

size_t encoder_qp_read(char *buffer,size_t size,_Bool ateof,curl_mimepart *part)

{
  byte bVar1;
  byte bVar2;
  undefined4 uVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  size_t sVar8;
  size_t n;
  ulong uVar9;
  bool bVar10;
  char buf [4];
  char cStack_51;
  undefined4 local_50;
  uint local_4c;
  mime_encoder_state *local_48;
  size_t local_40;
  size_t local_38;
  
  uVar9 = (part->encstate).bufbeg;
  if (uVar9 < (part->encstate).bufend) {
    local_38 = size;
    local_48 = &part->encstate;
    local_4c = (uint)ateof;
    sVar8 = 0;
    do {
      uVar3 = local_50;
      bVar1 = (part->encstate).buf[uVar9];
      bVar2 = ""[bVar1];
      n = (size_t)bVar2;
      local_50._0_2_ = CONCAT11("0123456789ABCDEF"[bVar1 >> 4],bVar1);
      local_50._3_1_ = SUB41(uVar3,3);
      local_50._0_3_ = CONCAT12("0123456789ABCDEF"[bVar1 & 0xf],(undefined2)local_50);
      uVar9 = n;
      if (bVar2 != 1) {
        if (bVar2 == 3) {
          iVar4 = qp_lookahead_eol(local_48,local_4c,0);
          if (iVar4 != 1) {
            if (iVar4 == -1) {
              return sVar8;
            }
            goto LAB_0013f067;
          }
          local_50._0_2_ = CONCAT11(10,(undefined1)local_50);
          n = 2;
          uVar9 = 2;
        }
        else {
          if (bVar2 == 2) {
            n = 1;
            iVar4 = qp_lookahead_eol(local_48,local_4c,1);
            if (iVar4 == 0) {
              uVar9 = 1;
              goto LAB_0013f096;
            }
            if (iVar4 == -1) {
              return sVar8;
            }
          }
          else {
LAB_0013f067:
          }
          local_50 = CONCAT31(local_50._1_3_,0x3d);
          n = 1;
          uVar9 = 3;
        }
      }
LAB_0013f096:
      local_40 = sVar8;
      if ((&cStack_51)[uVar9] != '\n') {
        uVar7 = local_48->pos + uVar9;
        if (uVar7 == 0x4c) {
          iVar4 = qp_lookahead_eol(local_48,local_4c,n);
          if (iVar4 != 0) {
            if (iVar4 == -1) {
              return local_40;
            }
            goto LAB_0013f0d7;
          }
        }
        else {
LAB_0013f0d7:
          if (uVar7 < 0x4d) goto LAB_0013f0ed;
        }
        local_50 = 0xa0d3d;
        uVar9 = 3;
        n = 0;
      }
LAB_0013f0ed:
      bVar10 = local_38 < uVar9;
      local_38 = local_38 - uVar9;
      if (bVar10) {
        return local_40;
      }
      memcpy(buffer,&local_50,uVar9);
      sVar8 = local_40 + uVar9;
      buffer = buffer + uVar9;
      sVar5 = (part->encstate).pos + uVar9;
      (part->encstate).pos = sVar5;
      sVar6 = 0;
      if (*(char *)((uVar9 - 1) + (long)&local_50) != '\n') {
        sVar6 = sVar5;
      }
      (part->encstate).pos = sVar6;
      uVar9 = n + (part->encstate).bufbeg;
      (part->encstate).bufbeg = uVar9;
    } while (uVar9 < (part->encstate).bufend);
  }
  else {
    sVar8 = 0;
  }
  return sVar8;
}

Assistant:

static size_t encoder_qp_read(char *buffer, size_t size, bool ateof,
                              curl_mimepart *part)
{
  mime_encoder_state *st = &part->encstate;
  char *ptr = buffer;
  size_t cursize = 0;
  int i;
  size_t len;
  size_t consumed;
  int softlinebreak;
  char buf[4];

  /* On all platforms, input is supposed to be ASCII compatible: for this
     reason, we use hexadecimal ASCII codes in this function rather than
     character constants that can be interpreted as non-ascii on some
     platforms. Preserve ASCII encoding on output too. */
  while(st->bufbeg < st->bufend) {
    len = 1;
    consumed = 1;
    i = st->buf[st->bufbeg];
    buf[0] = (char) i;
    buf[1] = aschex[(i >> 4) & 0xF];
    buf[2] = aschex[i & 0xF];

    switch(qp_class[st->buf[st->bufbeg] & 0xFF]) {
    case QP_OK:          /* Not a special character. */
      break;
    case QP_SP:          /* Space or tab. */
      /* Spacing must be escaped if followed by CRLF. */
      switch(qp_lookahead_eol(st, ateof, 1)) {
      case -1:          /* More input data needed. */
        return cursize;
      case 0:           /* No encoding needed. */
        break;
      default:          /* CRLF after space or tab. */
        buf[0] = '\x3D';    /* '=' */
        len = 3;
        break;
      }
      break;
    case QP_CR:         /* Carriage return. */
      /* If followed by a line-feed, output the CRLF pair.
         Else escape it. */
      switch(qp_lookahead_eol(st, ateof, 0)) {
      case -1:          /* Need more data. */
        return cursize;
      case 1:           /* CRLF found. */
        buf[len++] = '\x0A';    /* Append '\n'. */
        consumed = 2;
        break;
      default:          /* Not followed by LF: escape. */
        buf[0] = '\x3D';    /* '=' */
        len = 3;
        break;
      }
      break;
    default:            /* Character must be escaped. */
      buf[0] = '\x3D';    /* '=' */
      len = 3;
      break;
    }

    /* Be sure the encoded character fits within maximum line length. */
    if(buf[len - 1] != '\x0A') {    /* '\n' */
      softlinebreak = st->pos + len > MAX_ENCODED_LINE_LENGTH;
      if(!softlinebreak && st->pos + len == MAX_ENCODED_LINE_LENGTH) {
        /* We may use the current line only if end of data or followed by
           a CRLF. */
        switch(qp_lookahead_eol(st, ateof, consumed)) {
        case -1:        /* Need more data. */
          return cursize;
          break;
        case 0:         /* Not followed by a CRLF. */
          softlinebreak = 1;
          break;
        }
      }
      if(softlinebreak) {
        strcpy(buf, "\x3D\x0D\x0A");    /* "=\r\n" */
        len = 3;
        consumed = 0;
      }
    }

    /* If the output buffer would overflow, do not store. */
    if(len > size)
      break;

    /* Append to output buffer. */
    memcpy(ptr, buf, len);
    cursize += len;
    ptr += len;
    size -= len;
    st->pos += len;
    if(buf[len - 1] == '\x0A')    /* '\n' */
      st->pos = 0;
    st->bufbeg += consumed;
  }

  return cursize;
}